

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O1

hashtbl_node_t * hashtbl_get_node(cf_hashtbl_t *tbl,cf_void_t *key,cf_size_t len,cf_bool_t create)

{
  byte bVar1;
  int iVar2;
  cf_size_t cVar3;
  hashtbl_node_t *phVar4;
  hashtbl_node_t *phVar5;
  void *dst;
  uint uVar6;
  hashtbl_node **pphVar7;
  
  if (len == 0xffffffffffffffff) {
    bVar1 = *key;
    if (bVar1 == 0) {
      uVar6 = 0;
      len = 1;
    }
    else {
      uVar6 = 0;
      len = 1;
      do {
        uVar6 = uVar6 * 0x21 + (uint)bVar1;
        bVar1 = *(byte *)((long)key + len);
        len = len + 1;
      } while (bVar1 != 0);
    }
  }
  else if (len == 0) {
    uVar6 = 0;
  }
  else {
    cVar3 = 0;
    uVar6 = 0;
    do {
      uVar6 = (uint)*(byte *)((long)key + cVar3) + uVar6 * 0x21;
      cVar3 = cVar3 + 1;
    } while (len != cVar3);
  }
  uVar6 = uVar6 & tbl->hashmsk;
  phVar5 = tbl->table[uVar6];
  if (phVar5 == (hashtbl_node_t *)0x0) {
    pphVar7 = tbl->table + uVar6;
  }
  else {
    do {
      phVar4 = phVar5;
      if ((((phVar4->hash == uVar6) && (len == phVar4->keylen)) && (phVar4->key != (void *)0x0)) &&
         (iVar2 = bcmp(phVar4->key,key,len), iVar2 == 0)) {
        return phVar4;
      }
      phVar5 = phVar4->next;
    } while (phVar4->next != (hashtbl_node *)0x0);
    pphVar7 = &phVar4->next;
  }
  if (create == 0) {
    phVar5 = (hashtbl_node_t *)0x0;
  }
  else {
    phVar5 = (hashtbl_node_t *)calloc(1,0x30);
    phVar5->tbl = tbl;
    phVar5->hash = uVar6;
    dst = malloc(len);
    phVar5->key = dst;
    phVar5->keylen = len;
    cf_memcpy_s(dst,len,key,len);
    *pphVar7 = phVar5;
    tbl->size = tbl->size + 1;
  }
  return phVar5;
}

Assistant:

hashtbl_node_t* hashtbl_get_node(cf_hashtbl_t* tbl, const cf_void_t* key, cf_size_t len, cf_bool_t create) {
    cf_uint32_t hash = 0;
    hashtbl_node_t* node = CF_NULL_PTR, **list_entry = CF_NULL_PTR;

    hash = cf_hashtbl_calc_hash(key, &len) & tbl->hashmsk;

    for (list_entry = &tbl->table[hash], node = *list_entry;
         node;
         list_entry = &node->next, node = *list_entry) {
        if (node->hash == hash && len == node->keylen
            && node->key != CF_NULL_PTR && memcmp(node->key, key, len) == 0) {
            return node;
        }
    }

    if (!create) {
        return CF_NULL_PTR;
    }

    node = cf_malloc_z_native(sizeof(hashtbl_node_t));
    node->tbl = tbl;
    node->hash = hash; 
    node->key = cf_malloc_native(len);
    node->keylen = len;
    cf_memcpy_s(node->key, len, key, len);

    *list_entry = node;
    tbl->size++;
    return node;
}